

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KdTree.h
# Opt level: O1

vector<Point2D,_std::allocator<Point2D>_> * __thiscall
lazyTrees::LazyKdTree<Point2D>::in_box
          (vector<Point2D,_std::allocator<Point2D>_> *__return_storage_ptr__,
          LazyKdTree<Point2D> *this,Point2D *search,Point2D *sizes)

{
  pointer *ppPVar1;
  Point2D *pPVar2;
  iterator __position;
  LazyKdTree<Point2D> *pLVar3;
  pointer pPVar4;
  double dVar5;
  bool bVar6;
  bool bVar7;
  double *pdVar8;
  pointer pPVar9;
  size_t sVar10;
  vector<Point2D,_std::allocator<Point2D>_> local_78;
  double local_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  double local_40;
  double local_38;
  
  ensure_evaluated(this);
  pdVar8 = Point2D::operator[](sizes,0);
  if (*pdVar8 <= 0.0) {
    (__return_storage_ptr__->super__Vector_base<Point2D,_std::allocator<Point2D>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<Point2D,_std::allocator<Point2D>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<Point2D,_std::allocator<Point2D>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    return __return_storage_ptr__;
  }
  bVar7 = false;
  do {
    bVar6 = bVar7;
    if (bVar6) goto LAB_0014514c;
    pdVar8 = Point2D::operator[](sizes,1);
    bVar7 = true;
  } while (0.0 < *pdVar8);
  (__return_storage_ptr__->super__Vector_base<Point2D,_std::allocator<Point2D>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Point2D,_std::allocator<Point2D>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Point2D,_std::allocator<Point2D>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (!bVar6) {
    return __return_storage_ptr__;
  }
LAB_0014514c:
  (__return_storage_ptr__->super__Vector_base<Point2D,_std::allocator<Point2D>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Point2D,_std::allocator<Point2D>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Point2D,_std::allocator<Point2D>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar10 = 0;
  do {
    pPVar2 = (this->data)._M_t.super___uniq_ptr_impl<Point2D,_std::default_delete<Point2D>_>._M_t.
             super__Tuple_impl<0UL,_Point2D_*,_std::default_delete<Point2D>_>.
             super__Head_base<0UL,_Point2D_*,_false>._M_head_impl;
    pdVar8 = Point2D::operator[](search,sVar10);
    local_58 = *pdVar8;
    uStack_50 = 0;
    pdVar8 = Point2D::operator[](pPVar2,sVar10);
    local_60 = *pdVar8;
    pdVar8 = Point2D::operator[](sizes,sVar10);
    if (sVar10 != 0) break;
    sVar10 = 1;
  } while (ABS(local_58 - local_60) <= *pdVar8 * 0.5);
  if (ABS(local_58 - local_60) <= *pdVar8 * 0.5) {
    pPVar2 = (this->data)._M_t.super___uniq_ptr_impl<Point2D,_std::default_delete<Point2D>_>._M_t.
             super__Tuple_impl<0UL,_Point2D_*,_std::default_delete<Point2D>_>.
             super__Head_base<0UL,_Point2D_*,_false>._M_head_impl;
    __position._M_current =
         (__return_storage_ptr__->super__Vector_base<Point2D,_std::allocator<Point2D>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->super__Vector_base<Point2D,_std::allocator<Point2D>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Point2D,std::allocator<Point2D>>::_M_realloc_insert<Point2D_const&>
                ((vector<Point2D,std::allocator<Point2D>> *)__return_storage_ptr__,__position,pPVar2
                );
    }
    else {
      dVar5 = pPVar2->y;
      (__position._M_current)->x = pPVar2->x;
      (__position._M_current)->y = dVar5;
      ppPVar1 = &(__return_storage_ptr__->super__Vector_base<Point2D,_std::allocator<Point2D>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppPVar1 = *ppPVar1 + 1;
    }
  }
  if ((this->childPositive)._M_t.
      super___uniq_ptr_impl<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
      .super__Head_base<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_false>._M_head_impl ==
      (LazyKdTree<Point2D> *)0x0 &&
      (this->childNegative)._M_t.
      super___uniq_ptr_impl<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
      .super__Head_base<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_false>._M_head_impl ==
      (LazyKdTree<Point2D> *)0x0) {
    return __return_storage_ptr__;
  }
  pPVar2 = (this->data)._M_t.super___uniq_ptr_impl<Point2D,_std::default_delete<Point2D>_>._M_t.
           super__Tuple_impl<0UL,_Point2D_*,_std::default_delete<Point2D>_>.
           super__Head_base<0UL,_Point2D_*,_false>._M_head_impl;
  sVar10 = this->dim;
  pdVar8 = Point2D::operator[](search,sVar10);
  local_58 = *pdVar8;
  pdVar8 = Point2D::operator[](pPVar2,sVar10);
  local_60 = *pdVar8;
  if (local_58 <= local_60) {
    pLVar3 = (this->childNegative)._M_t.
             super___uniq_ptr_impl<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
             .super__Head_base<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_false>._M_head_impl;
    if (pLVar3 != (LazyKdTree<Point2D> *)0x0) {
      in_box(&local_78,pLVar3,search,sizes);
      pPVar9 = (__return_storage_ptr__->super__Vector_base<Point2D,_std::allocator<Point2D>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pPVar4 = (__return_storage_ptr__->super__Vector_base<Point2D,_std::allocator<Point2D>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      if (pPVar9 == pPVar4) goto LAB_00145322;
      std::vector<Point2D,_std::allocator<Point2D>_>::reserve
                (__return_storage_ptr__,
                 ((long)local_78.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_78.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                        super__Vector_impl_data._M_start >> 4) + ((long)pPVar4 - (long)pPVar9 >> 4))
      ;
      std::vector<Point2D,std::allocator<Point2D>>::
      _M_range_insert<std::move_iterator<__gnu_cxx::__normal_iterator<Point2D*,std::vector<Point2D,std::allocator<Point2D>>>>>
                ((vector<Point2D,std::allocator<Point2D>> *)__return_storage_ptr__,
                 (__return_storage_ptr__->super__Vector_base<Point2D,_std::allocator<Point2D>_>).
                 _M_impl.super__Vector_impl_data._M_finish,
                 local_78.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_78.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      goto LAB_00145350;
    }
  }
  else {
    pLVar3 = (this->childPositive)._M_t.
             super___uniq_ptr_impl<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
             .super__Head_base<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_false>._M_head_impl;
    if (pLVar3 != (LazyKdTree<Point2D> *)0x0) {
      in_box(&local_78,pLVar3,search,sizes);
      pPVar9 = (__return_storage_ptr__->super__Vector_base<Point2D,_std::allocator<Point2D>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pPVar4 = (__return_storage_ptr__->super__Vector_base<Point2D,_std::allocator<Point2D>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      if (pPVar9 == pPVar4) {
LAB_00145322:
        (__return_storage_ptr__->super__Vector_base<Point2D,_std::allocator<Point2D>_>)._M_impl.
        super__Vector_impl_data._M_start =
             local_78.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
             super__Vector_impl_data._M_start;
        (__return_storage_ptr__->super__Vector_base<Point2D,_std::allocator<Point2D>_>)._M_impl.
        super__Vector_impl_data._M_finish =
             local_78.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
             super__Vector_impl_data._M_finish;
        (__return_storage_ptr__->super__Vector_base<Point2D,_std::allocator<Point2D>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_78.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_78.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_78.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_78.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (pPVar9 != (pointer)0x0) {
          operator_delete(pPVar9);
        }
      }
      else {
        std::vector<Point2D,_std::allocator<Point2D>_>::reserve
                  (__return_storage_ptr__,
                   ((long)local_78.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_78.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                          super__Vector_impl_data._M_start >> 4) +
                   ((long)pPVar4 - (long)pPVar9 >> 4));
        std::vector<Point2D,std::allocator<Point2D>>::
        _M_range_insert<std::move_iterator<__gnu_cxx::__normal_iterator<Point2D*,std::vector<Point2D,std::allocator<Point2D>>>>>
                  ((vector<Point2D,std::allocator<Point2D>> *)__return_storage_ptr__,
                   (__return_storage_ptr__->super__Vector_base<Point2D,_std::allocator<Point2D>_>).
                   _M_impl.super__Vector_impl_data._M_finish,
                   local_78.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   local_78.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                   super__Vector_impl_data._M_finish);
      }
LAB_00145350:
      if (local_78.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
  }
  pdVar8 = Point2D::operator[](search,this->dim);
  local_40 = *pdVar8;
  pdVar8 = Point2D::operator[](sizes,this->dim);
  local_48 = *pdVar8;
  pdVar8 = Point2D::operator[](search,this->dim);
  local_38 = *pdVar8;
  pdVar8 = Point2D::operator[](sizes,this->dim);
  if ((local_60 < local_58) ||
     ((this->childPositive)._M_t.
      super___uniq_ptr_impl<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
      .super__Head_base<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_false>._M_head_impl ==
      (LazyKdTree<Point2D> *)0x0)) {
    if (local_58 <= local_60) {
      return __return_storage_ptr__;
    }
    if ((this->childNegative)._M_t.
        super___uniq_ptr_impl<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
        .super__Head_base<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_false>._M_head_impl ==
        (LazyKdTree<Point2D> *)0x0) {
      return __return_storage_ptr__;
    }
    pdVar8 = Point2D::operator[]((this->data)._M_t.
                                 super___uniq_ptr_impl<Point2D,_std::default_delete<Point2D>_>._M_t.
                                 super__Tuple_impl<0UL,_Point2D_*,_std::default_delete<Point2D>_>.
                                 super__Head_base<0UL,_Point2D_*,_false>._M_head_impl,this->dim);
    if (*pdVar8 < local_48 * -0.5 + local_40) {
      return __return_storage_ptr__;
    }
    in_box(&local_78,
           (this->childNegative)._M_t.
           super___uniq_ptr_impl<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
           .super__Head_base<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_false>._M_head_impl,search,sizes
          );
    pPVar9 = (__return_storage_ptr__->super__Vector_base<Point2D,_std::allocator<Point2D>_>)._M_impl
             .super__Vector_impl_data._M_start;
    pPVar4 = (__return_storage_ptr__->super__Vector_base<Point2D,_std::allocator<Point2D>_>)._M_impl
             .super__Vector_impl_data._M_finish;
    if (pPVar9 != pPVar4) {
      std::vector<Point2D,_std::allocator<Point2D>_>::reserve
                (__return_storage_ptr__,
                 ((long)local_78.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_78.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                        super__Vector_impl_data._M_start >> 4) + ((long)pPVar4 - (long)pPVar9 >> 4))
      ;
      std::vector<Point2D,std::allocator<Point2D>>::
      _M_range_insert<std::move_iterator<__gnu_cxx::__normal_iterator<Point2D*,std::vector<Point2D,std::allocator<Point2D>>>>>
                ((vector<Point2D,std::allocator<Point2D>> *)__return_storage_ptr__,
                 (__return_storage_ptr__->super__Vector_base<Point2D,_std::allocator<Point2D>_>).
                 _M_impl.super__Vector_impl_data._M_finish,
                 local_78.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_78.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      goto LAB_00145533;
    }
  }
  else {
    local_58 = *pdVar8;
    pdVar8 = Point2D::operator[]((this->data)._M_t.
                                 super___uniq_ptr_impl<Point2D,_std::default_delete<Point2D>_>._M_t.
                                 super__Tuple_impl<0UL,_Point2D_*,_std::default_delete<Point2D>_>.
                                 super__Head_base<0UL,_Point2D_*,_false>._M_head_impl,this->dim);
    if (local_58 * 0.5 + local_38 < *pdVar8) {
      return __return_storage_ptr__;
    }
    in_box(&local_78,
           (this->childPositive)._M_t.
           super___uniq_ptr_impl<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
           .super__Head_base<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_false>._M_head_impl,search,sizes
          );
    pPVar9 = (__return_storage_ptr__->super__Vector_base<Point2D,_std::allocator<Point2D>_>)._M_impl
             .super__Vector_impl_data._M_start;
    pPVar4 = (__return_storage_ptr__->super__Vector_base<Point2D,_std::allocator<Point2D>_>)._M_impl
             .super__Vector_impl_data._M_finish;
    if (pPVar9 != pPVar4) {
      std::vector<Point2D,_std::allocator<Point2D>_>::reserve
                (__return_storage_ptr__,
                 ((long)local_78.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_78.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                        super__Vector_impl_data._M_start >> 4) + ((long)pPVar4 - (long)pPVar9 >> 4))
      ;
      std::vector<Point2D,std::allocator<Point2D>>::
      _M_range_insert<std::move_iterator<__gnu_cxx::__normal_iterator<Point2D*,std::vector<Point2D,std::allocator<Point2D>>>>>
                ((vector<Point2D,std::allocator<Point2D>> *)__return_storage_ptr__,
                 (__return_storage_ptr__->super__Vector_base<Point2D,_std::allocator<Point2D>_>).
                 _M_impl.super__Vector_impl_data._M_finish,
                 local_78.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_78.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      goto LAB_00145533;
    }
  }
  (__return_storage_ptr__->super__Vector_base<Point2D,_std::allocator<Point2D>_>)._M_impl.
  super__Vector_impl_data._M_start =
       local_78.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
       super__Vector_impl_data._M_start;
  (__return_storage_ptr__->super__Vector_base<Point2D,_std::allocator<Point2D>_>)._M_impl.
  super__Vector_impl_data._M_finish =
       local_78.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->super__Vector_base<Point2D,_std::allocator<Point2D>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_78.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_78.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_78.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_78.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (pPVar9 != (pointer)0x0) {
    operator_delete(pPVar9);
  }
LAB_00145533:
  if (local_78.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<P> in_box(P const& search, P const& sizes)
    {
        ensure_evaluated();

        for (size_t i = 0; i < P::dimensions(); ++i) {
            if (sizes[i] <= 0.0)
                return std::vector<P>(); // no real search if one dimension size is <= 0
        }

        std::vector<P> res; // all points within the box

        bool inBox = true;
        for (size_t i = 0; i < P::dimensions() && inBox; ++i)
            inBox = dimension_dist(search, *(data.get()), i) <= 0.5 * sizes[i];

        if (inBox) res.push_back(*(data.get()));

        if (is_leaf()) return res; // no children, return result

        // decide which side to check and recurse into it
        const auto comp = dimension_compare(search, *(data.get()), dim);
        if (comp == NEGATIVE) {
            if (childNegative)
                move_append(childNegative->in_box(search, sizes), res);
        } else if (childPositive) {
            move_append(childPositive->in_box(search, sizes), res);
        }

        const double borderNegative = search[dim] - 0.5 * sizes[dim];
        const double borderPositive = search[dim] + 0.5 * sizes[dim];

        // check whether distances to other side are smaller than radius
        // and recurse into the "wrong" direction, to check for possibly additional
        // candidates
        if (comp == NEGATIVE && childPositive) {
            if (borderPositive >= (*data.get())[dim])
                move_append(childPositive->in_box(search, sizes), res);
        } else if (comp == POSITIVE && childNegative) {
            if (borderNegative <= (*data.get())[dim])
                move_append(childNegative->in_box(search, sizes), res);
        }

        return res;
    }